

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O3

void __thiscall
absl::lts_20240722::Cord::ChunkIterator::AdvanceBytesBtree(ChunkIterator *this,size_t n)

{
  ulong uVar1;
  CordRepBtree *pCVar2;
  size_t sVar3;
  long lVar4;
  string_view sVar5;
  
  uVar1 = (this->current_chunk_)._M_len;
  if (n < uVar1) {
    __assert_fail("n >= current_chunk_.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                  ,0x60a,"void absl::Cord::ChunkIterator::AdvanceBytesBtree(size_t)");
  }
  sVar3 = this->bytes_remaining_ - n;
  this->bytes_remaining_ = sVar3;
  if (sVar3 == 0) {
    (this->current_chunk_)._M_len = 0;
    (this->current_chunk_)._M_str = (char *)0x0;
  }
  else {
    if (uVar1 == n) {
      sVar5 = cord_internal::CordRepBtreeReader::Next(&this->btree_reader_);
    }
    else {
      lVar4 = (long)(this->btree_reader_).navigator_.height_;
      if ((lVar4 < 0) ||
         (pCVar2 = (this->btree_reader_).navigator_.node_[lVar4], pCVar2 == (CordRepBtree *)0x0)) {
        __assert_fail("btree() != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.h"
                      ,0xa3,"size_t absl::cord_internal::CordRepBtreeReader::length() const");
      }
      sVar5 = cord_internal::CordRepBtreeReader::Seek(&this->btree_reader_,*(long *)pCVar2 - sVar3);
    }
    this->current_chunk_ = sVar5;
  }
  return;
}

Assistant:

~Cord() {
    if (contents_.is_tree()) DestroyCordSlow();
  }